

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy32_s.c
# Opt level: O0

errno_t memcpy32_s(uint32_t *dest,rsize_t dmax,uint32_t *src,rsize_t smax)

{
  long lVar1;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  uint32_t *in_RSI;
  uint32_t *in_RDI;
  long in_FS_OFFSET;
  errno_t in_stack_ffffffffffffffcc;
  uint32_t value;
  uint32_t len;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (uint32_t *)0x0) {
    invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
    local_c = 400;
  }
  else if (in_RSI == (uint32_t *)0x0) {
    invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
    local_c = 0x191;
  }
  else if (in_RSI < (uint32_t *)0x4000001) {
    value = (uint32_t)in_RCX;
    len = (uint32_t)((ulong)in_RCX >> 0x20);
    if (in_RCX == (uint32_t *)0x0) {
      mem_prim_set32(in_RDX,len,value);
      invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 0x191;
    }
    else if (in_RSI < in_RCX) {
      mem_prim_set32(in_RDX,len,value);
      invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 0x193;
    }
    else if (in_RDX == (uint32_t *)0x0) {
      mem_prim_set32((uint32_t *)0x0,len,value);
      invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 400;
    }
    else if (((in_RDX < in_RDI) && (in_RDI < in_RDX + (long)in_RCX)) ||
            ((in_RDI < in_RDX && (in_RDX < in_RDI + (long)in_RSI)))) {
      mem_prim_set32(in_RDX,len,value);
      invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
      local_c = 0x194;
    }
    else {
      mem_prim_move32(in_RDI,in_RSI,(uint32_t)((ulong)in_RDX >> 0x20));
      local_c = 0;
    }
  }
  else {
    invoke_safe_mem_constraint_handler((char *)in_RDX,in_RCX,in_stack_ffffffffffffffcc);
    local_c = 0x193;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memcpy32_s (uint32_t *dest, rsize_t dmax, const uint32_t *src, rsize_t smax)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memcpy32_s: dest is NULL",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (dmax == 0) {
        invoke_safe_mem_constraint_handler("memcpy32_s: dmax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (dmax > RSIZE_MAX_MEM32) {
        invoke_safe_mem_constraint_handler("memcpy32_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (smax == 0) {
        mem_prim_set32(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy32_s: smax is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (smax > dmax) {
        mem_prim_set32(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy32_s: smax exceeds dmax",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    if (src == NULL) {
        mem_prim_set32(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy32_s: src is NULL",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    /*
     * overlap is undefined behavior, do not allow
     */
    if( ((dest > src) && (dest < (src+smax))) ||
        ((src > dest) && (src < (dest+dmax))) ) {
        mem_prim_set32(dest, dmax, 0);
        invoke_safe_mem_constraint_handler("memcpy32_s: overlap undefined",
                   NULL, ESOVRLP);
        return (RCNEGATE(ESOVRLP));
    }

    /*
     * now perform the copy
     */
    mem_prim_move32(dest, src, smax);

    return (RCNEGATE(EOK));
}